

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_consolebuffer.cpp
# Opt level: O2

void __thiscall FConsoleBuffer::WriteLineToLog(FConsoleBuffer *this,FILE *LogFile,char *outline)

{
  size_t sVar1;
  char *__s;
  char *pcVar2;
  char cVar3;
  char *pcVar4;
  
  sVar1 = strlen(outline);
  __s = (char *)operator_new__(sVar1 + 1);
  pcVar2 = __s;
LAB_00372a67:
  do {
    cVar3 = *outline;
    switch(cVar3) {
    case '\x1c':
      if (outline[1] == '[') {
        for (pcVar4 = outline + 2; (cVar3 = *pcVar4, cVar3 != '\0' && (cVar3 != ']'));
            pcVar4 = pcVar4 + 1) {
        }
        outline = pcVar4 + (cVar3 == ']');
      }
      else {
        if (outline[1] == '\0') {
LAB_00372ad0:
          *pcVar2 = '\0';
          fputs(__s,(FILE *)LogFile);
          operator_delete__(__s);
          fflush((FILE *)LogFile);
          return;
        }
        outline = outline + 2;
      }
      goto LAB_00372a67;
    case '\x1d':
      cVar3 = '<';
      break;
    case '\x1e':
      cVar3 = '-';
      break;
    case '\x1f':
      cVar3 = '>';
      break;
    default:
      if (cVar3 == '\0') goto LAB_00372ad0;
    }
    *pcVar2 = cVar3;
    pcVar2 = pcVar2 + 1;
    outline = outline + 1;
  } while( true );
}

Assistant:

void FConsoleBuffer::WriteLineToLog(FILE *LogFile, const char *outline)
{
	// Strip out any color escape sequences before writing to the log file
	char * copy = new char[strlen(outline)+1];
	const char * srcp = outline;
	char * dstp = copy;

	while (*srcp != 0)
	{

		if (*srcp != TEXTCOLOR_ESCAPE)
		{
			switch (*srcp)
			{
				case '\35':
					*dstp++ = '<';
					break;
				
				case '\36':
					*dstp++ = '-';
					break;
				
				case '\37':
					*dstp++ = '>';
					break;
					
				default:
					*dstp++=*srcp;
					break;
			}
			srcp++;
		}
		else if (srcp[1] == '[')
		{
			srcp+=2;
			while (*srcp != ']' && *srcp != 0) srcp++;
			if (*srcp == ']') srcp++;
		}
		else
		{
			if (srcp[1]!=0) srcp+=2;
			else break;
		}
	}
	*dstp=0;

	fputs (copy, LogFile);
	delete [] copy;
	fflush (LogFile);
}